

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

idx_t duckdb::TernaryExecutor::
      SelectLoop<duckdb::interval_t,duckdb::interval_t,duckdb::interval_t,duckdb::BothInclusiveBetweenOperator,false,true,true>
                (interval_t *adata,interval_t *bdata,interval_t *cdata,SelectionVector *result_sel,
                idx_t count,SelectionVector *asel,SelectionVector *bsel,SelectionVector *csel,
                ValidityMask *avalidity,ValidityMask *bvalidity,ValidityMask *cvalidity,
                SelectionVector *true_sel,SelectionVector *false_sel)

{
  sel_t *psVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  unsigned_long *puVar5;
  unsigned_long *puVar6;
  unsigned_long *puVar7;
  sel_t *psVar8;
  sel_t *psVar9;
  long lVar10;
  bool bVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  idx_t iVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  long lVar24;
  
  if (count == 0) {
    iVar20 = 0;
  }
  else {
    psVar1 = result_sel->sel_vector;
    psVar2 = asel->sel_vector;
    psVar3 = bsel->sel_vector;
    psVar4 = csel->sel_vector;
    puVar5 = (avalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar6 = (bvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    puVar7 = (cvalidity->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    psVar8 = true_sel->sel_vector;
    psVar9 = false_sel->sel_vector;
    iVar20 = 0;
    lVar18 = 0;
    uVar19 = 0;
    do {
      uVar12 = uVar19;
      if (psVar1 != (sel_t *)0x0) {
        uVar12 = (ulong)psVar1[uVar19];
      }
      uVar13 = uVar19;
      if (psVar2 != (sel_t *)0x0) {
        uVar13 = (ulong)psVar2[uVar19];
      }
      uVar14 = uVar19;
      if (psVar3 != (sel_t *)0x0) {
        uVar14 = (ulong)psVar3[uVar19];
      }
      uVar23 = uVar19;
      if (psVar4 != (sel_t *)0x0) {
        uVar23 = (ulong)psVar4[uVar19];
      }
      if ((((puVar5 == (unsigned_long *)0x0) || ((puVar5[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) != 0))
          && ((puVar6 == (unsigned_long *)0x0 || ((puVar6[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) != 0)
              ))) &&
         ((puVar7 == (unsigned_long *)0x0 || ((puVar7[uVar23 >> 6] >> (uVar23 & 0x3f) & 1) != 0))))
      {
        lVar22._0_4_ = adata[uVar13].months;
        lVar22._4_4_ = adata[uVar13].days;
        lVar16._0_4_ = bdata[uVar14].months;
        lVar16._4_4_ = bdata[uVar14].days;
        lVar15 = (lVar16 >> 0x20) + bdata[uVar14].micros / 86400000000;
        lVar17 = lVar15 % 0x1e;
        lVar15 = (long)(int)(undefined4)lVar16 + lVar15 / 0x1e;
        lVar16 = (lVar22 >> 0x20) + adata[uVar13].micros / 86400000000;
        lVar21 = adata[uVar13].micros % 86400000000;
        lVar24 = lVar16 % 0x1e;
        lVar22 = (long)(int)(undefined4)lVar22 + lVar16 / 0x1e;
        if (lVar15 <= lVar22) {
          lVar10._0_4_ = cdata[uVar23].months;
          lVar10._4_4_ = cdata[uVar23].days;
          if ((lVar15 < lVar22) ||
             ((lVar17 <= lVar24 &&
              ((lVar17 < lVar24 || (bdata[uVar14].micros % 86400000000 <= lVar21)))))) {
            lVar16 = (lVar10 >> 0x20) + cdata[uVar23].micros / 86400000000;
            lVar15 = lVar16 % 0x1e;
            lVar16 = (long)(int)(undefined4)lVar10 + lVar16 / 0x1e;
            if (lVar22 <= lVar16) {
              bVar11 = true;
              if (lVar16 <= lVar22) {
                if (lVar15 < lVar24) goto LAB_003da7d6;
                bVar11 = lVar21 <= cdata[uVar23].micros % 86400000000 || lVar24 < lVar15;
              }
              goto LAB_003da804;
            }
          }
        }
        bVar11 = false;
      }
      else {
LAB_003da7d6:
        bVar11 = false;
      }
LAB_003da804:
      psVar8[iVar20] = (sel_t)uVar12;
      iVar20 = iVar20 + bVar11;
      psVar9[lVar18] = (sel_t)uVar12;
      lVar18 = lVar18 + (ulong)(bVar11 ^ 1);
      uVar19 = uVar19 + 1;
    } while (count != uVar19);
  }
  return iVar20;
}

Assistant:

static inline idx_t SelectLoop(const A_TYPE *__restrict adata, const B_TYPE *__restrict bdata,
	                               const C_TYPE *__restrict cdata, const SelectionVector *result_sel, idx_t count,
	                               const SelectionVector &asel, const SelectionVector &bsel,
	                               const SelectionVector &csel, ValidityMask &avalidity, ValidityMask &bvalidity,
	                               ValidityMask &cvalidity, SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		for (idx_t i = 0; i < count; i++) {
			auto result_idx = result_sel->get_index(i);
			auto aidx = asel.get_index(i);
			auto bidx = bsel.get_index(i);
			auto cidx = csel.get_index(i);
			bool comparison_result =
			    (NO_NULL || (avalidity.RowIsValid(aidx) && bvalidity.RowIsValid(bidx) && cvalidity.RowIsValid(cidx))) &&
			    OP::Operation(adata[aidx], bdata[bidx], cdata[cidx]);
			if (HAS_TRUE_SEL) {
				true_sel->set_index(true_count, result_idx);
				true_count += comparison_result;
			}
			if (HAS_FALSE_SEL) {
				false_sel->set_index(false_count, result_idx);
				false_count += !comparison_result;
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}